

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

void __thiscall CTcDataStream::CTcDataStream(CTcDataStream *this,char stream_id)

{
  void *pvVar1;
  undefined1 in_SIL;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__CTcDataStream_0042f808;
  *(undefined1 *)(in_RDI + 0xc) = in_SIL;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[5] = 0;
  in_RDI[4] = 0;
  in_RDI[3] = 0;
  in_RDI[10] = 0;
  in_RDI[9] = 0;
  pvVar1 = operator_new(0x20);
  CTcPrsMem::CTcPrsMem((CTcPrsMem *)0x29cb55);
  in_RDI[0xb] = pvVar1;
  return;
}

Assistant:

CTcDataStream::CTcDataStream(char stream_id)
{
    /* remember my ID */
    stream_id_ = stream_id;

    /* nothing is allocated yet */
    ofs_ = 0;
    obj_file_start_ofs_ = 0;
    pages_ = 0;
    page_slots_ = 0;
    page_cnt_ = 0;
    page_cur_ = 0;
    rem_ = 0;
    wp_ = 0;

    /* we have no anchors yet */
    first_anchor_ = last_anchor_ = 0;

    /* create our parser memory allocator */
    allocator_ = new CTcPrsMem();
}